

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::decodeOpcode(MipsParser *this,string *name,tMipsOpcode *opcode)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  size_t local_38;
  size_t pos;
  char *encoding;
  tMipsOpcode *opcode_local;
  string *name_local;
  MipsParser *this_local;
  
  pos = (size_t)opcode->name;
  local_38 = 0;
  encoding = (char *)opcode;
  opcode_local = (tMipsOpcode *)name;
  name_local = (string *)this;
  MipsRegisterData::reset(&this->registers);
  MipsImmediateData::reset(&this->immediate);
  MipsOpcodeData::reset(&this->opcodeData);
  this->hasFixedSecondaryImmediate = false;
  do {
    while( true ) {
      while( true ) {
        sVar2 = local_38;
        if (*(char *)pos == '\0') {
          uVar4 = std::__cxx11::string::size();
          return uVar4 <= sVar2;
        }
        sVar6 = pos + 1;
        if (*(char *)pos != 'B') break;
        pos = sVar6;
        bVar3 = decodeCop2BranchCondition
                          (this,(string *)opcode_local,&local_38,
                           &(this->immediate).secondary.originalValue);
        if (!bVar3) {
          return false;
        }
        (this->immediate).secondary.type = Cop2BranchType;
        (this->immediate).secondary.value = (this->immediate).secondary.originalValue;
        this->hasFixedSecondaryImmediate = true;
      }
      if (*(char *)pos != 'S') break;
      pos = sVar6;
      bVar3 = decodeVfpuType(this,(string *)opcode_local,&local_38,&(this->opcodeData).vfpuSize);
      if (!bVar3) {
        return false;
      }
    }
    pos = sVar6;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= sVar2) {
      return false;
    }
    cVar1 = *(char *)(pos - 1);
    local_38 = local_38 + 1;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)opcode_local);
  } while (cVar1 == *pcVar5);
  return false;
}

Assistant:

bool MipsParser::decodeOpcode(const std::string& name, const tMipsOpcode& opcode)
{
	const char* encoding = opcode.name;
	size_t pos = 0;

	registers.reset();
	immediate.reset();
	opcodeData.reset();
	hasFixedSecondaryImmediate = false;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'S':
			CHECK(decodeVfpuType(name,pos,opcodeData.vfpuSize));
			break;
		case 'B':
			CHECK(decodeCop2BranchCondition(name,pos,immediate.secondary.originalValue));
			immediate.secondary.type = MipsImmediateType::Cop2BranchType;
			immediate.secondary.value = immediate.secondary.originalValue;
			hasFixedSecondaryImmediate = true;
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}